

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O3

void chck_tqueue_set_fd(chck_tqueue *tqueue,int fd)

{
  int iVar1;
  
  if (tqueue != (chck_tqueue *)0x0) {
    creator_thread((chck_tqueue *)(tqueue->threads).self,"chck_tqueue_set_fd");
    iVar1 = (tqueue->tasks).fd;
    if (-1 < iVar1) {
      close(iVar1);
    }
    iVar1 = dup(fd);
    (tqueue->tasks).fd = iVar1;
    return;
  }
  __assert_fail("tqueue",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/thread/queue/queue.c"
                ,0x118,"void chck_tqueue_set_fd(struct chck_tqueue *, int)");
}

Assistant:

void
chck_tqueue_set_fd(struct chck_tqueue *tqueue, int fd)
{
   assert(tqueue);

   // Allowed only on creator thread.
   if (!tqueue || !creator_thread(tqueue))
      return;

   if (tqueue->tasks.fd >= 0)
      close(tqueue->tasks.fd);

   tqueue->tasks.fd = dup(fd);
}